

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_dynhds_add_custom(Curl_easy *data,_Bool is_connect,dynhds *hds)

{
  char *__s;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t valuelen;
  undefined7 in_register_00000031;
  curl_slist *pcVar5;
  size_t max;
  char cVar6;
  bool bVar7;
  curl_slist *h [2];
  long local_68;
  CURLcode local_5c;
  curl_slist *local_58 [2];
  connectdata *local_48;
  dynhds *local_40;
  long local_38;
  
  local_40 = hds;
  local_48 = data->conn;
  cVar6 = '\x02';
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    cVar6 = ((ulong)data->conn->bits & 9) == 1;
  }
  if (cVar6 == '\x02') {
    if (((data->set).field_0x8ca & 8) == 0) goto LAB_00134861;
    local_58[0] = (data->set).proxyheaders;
  }
  else {
    if (cVar6 == '\x01') {
      local_58[0] = (data->set).headers;
      local_68 = 1;
      if (((data->set).field_0x8ca & 8) != 0) {
        local_58[1] = (data->set).proxyheaders;
        local_68 = 2;
      }
      goto LAB_0013487f;
    }
LAB_00134861:
    local_58[0] = (data->set).headers;
  }
  local_68 = 1;
LAB_0013487f:
  local_38 = 0;
  do {
    for (pcVar5 = local_58[local_38]; pcVar5 != (curl_slist *)0x0; pcVar5 = pcVar5->next) {
      __s = pcVar5->data;
      pcVar4 = strchr(__s,0x3a);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = strchr(__s,0x3b);
        bVar7 = false;
        if (pcVar4 != (char *)0x0) {
          max = (long)pcVar4 - (long)__s;
          do {
            do {
              do {
                pcVar4 = pcVar4 + 1;
                cVar6 = *pcVar4;
              } while (cVar6 == '\t');
            } while (cVar6 == ' ');
            if (cVar6 == '\0') goto LAB_00134930;
          } while ((byte)(cVar6 - 10U) < 4);
          if (cVar6 == '\0') {
LAB_00134930:
            pcVar4 = "";
            valuelen = 0;
            goto LAB_00134939;
          }
        }
      }
      else {
        max = (long)pcVar4 - (long)__s;
        do {
          do {
            do {
              pcVar4 = pcVar4 + 1;
              cVar6 = *pcVar4;
            } while (cVar6 == '\t');
          } while (cVar6 == ' ');
          if (cVar6 == '\0') goto LAB_001348e0;
        } while ((byte)(cVar6 - 10U) < 4);
        if (cVar6 == '\0') {
LAB_001348e0:
          bVar7 = false;
        }
        else {
          valuelen = strlen(pcVar4);
LAB_00134939:
          if ((((((max == 5) && ((data->state).aptr.host != (char *)0x0)) &&
                (iVar2 = curl_strnequal(__s,"Host:",5), iVar2 != 0)) ||
               (((max == 0xd && ((data->state).httpreq == '\x02')) &&
                (iVar2 = curl_strnequal(__s,"Content-Type:",0xd), iVar2 != 0)))) ||
              (((max == 0xd && ((data->state).httpreq == '\x03')) &&
               (iVar2 = curl_strnequal(__s,"Content-Type:",0xd), iVar2 != 0)))) ||
             ((((max == 0xf && ((*(uint *)&(data->req).field_0xd9 & 0x40000) != 0)) &&
               (iVar2 = curl_strnequal(__s,"Content-Length:",0xf), iVar2 != 0)) ||
              (((max == 0xb && ((data->state).aptr.te != (char *)0x0)) &&
               (iVar2 = curl_strnequal(__s,"Connection:",0xb), iVar2 != 0)))))) {
LAB_00134abb:
            bVar7 = false;
          }
          else {
            if (local_48->httpversion < 0x14) {
LAB_00134a47:
              if (max == 7) goto LAB_00134a6f;
              if (max == 0xe) {
LAB_00134a53:
                iVar2 = curl_strnequal(__s,"Authorization:",max);
                if (iVar2 == 0) {
                  if (max == 7) goto LAB_00134a6f;
                  goto LAB_00134a91;
                }
                goto LAB_00134a85;
              }
            }
            else {
              if (max != 7) {
                if (max == 0xe) goto LAB_00134a53;
                if (max == 0x12) {
                  iVar2 = curl_strnequal(__s,"Transfer-Encoding:",0x12);
                  if (iVar2 != 0) goto LAB_00134abb;
                  goto LAB_00134a47;
                }
                goto LAB_00134a91;
              }
LAB_00134a6f:
              iVar2 = curl_strnequal(__s,"Cookie:",max);
              if (iVar2 != 0) {
LAB_00134a85:
                _Var1 = Curl_auth_allowed_to_host(data);
                if (!_Var1) goto LAB_00134abb;
              }
            }
LAB_00134a91:
            CVar3 = Curl_dynhds_add(local_40,__s,max,pcVar4,valuelen);
            bVar7 = CVar3 != CURLE_OK;
            if (bVar7) {
              local_5c = CVar3;
            }
          }
        }
      }
      if (bVar7) {
        return local_5c;
      }
    }
    local_38 = local_38 + 1;
    if (local_38 == local_68) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_dynhds_add_custom(struct Curl_easy *data,
                                bool is_connect,
                                struct dynhds *hds)
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      const char *name, *value;
      size_t namelen, valuelen;

      /* There are 2 quirks in place for custom headers:
       * 1. setting only 'name:' to suppress a header from being sent
       * 2. setting only 'name;' to send an empty (illegal) header
       */
      ptr = strchr(headers->data, ':');
      if(ptr) {
        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(*ptr) {
          value = ptr;
          valuelen = strlen(value);
        }
        else {
          /* quirk #1, suppress this header */
          continue;
        }
      }
      else {
        ptr = strchr(headers->data, ';');

        if(!ptr) {
          /* neither : nor ; in provided header value. We seem
           * to ignore this silently */
          continue;
        }

        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the semicolon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(!*ptr) {
          /* quirk #2, send an empty header */
          value = "";
          valuelen = 0;
        }
        else {
          /* this may be used for something else in the future,
           * ignore this for now */
          continue;
        }
      }

      DEBUGASSERT(name && value);
      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom Host:
            header as that will produce *two* in the same request! */
         hd_name_eq(name, namelen, STRCONST("Host:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              hd_name_eq(name, namelen, STRCONST("Content-Length:")))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              hd_name_eq(name, namelen, STRCONST("Connection:")))
        ;
      else if((conn->httpversion >= 20) &&
              hd_name_eq(name, namelen, STRCONST("Transfer-Encoding:")))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((hd_name_eq(name, namelen, STRCONST("Authorization:")) ||
               hd_name_eq(name, namelen, STRCONST("Cookie:"))) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else {
        CURLcode result;

        result = Curl_dynhds_add(hds, name, namelen, value, valuelen);
        if(result)
          return result;
      }
    }
  }

  return CURLE_OK;
}